

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O3

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_internal(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *this,bool keep,
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *result)

{
  _Rb_tree_header *p_Var1;
  number_float_t nVar2;
  bool bVar3;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  value_t t;
  bool bVar4;
  token_type tVar5;
  json_value jVar6;
  object_t *poVar7;
  array_t *paVar8;
  out_of_range *__return_storage_ptr__;
  long *plVar9;
  size_type *psVar10;
  int iVar11;
  string_t key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  k;
  parse_event_t local_c1;
  undefined1 local_c0 [8];
  json_value local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_a0;
  json_value *local_98;
  undefined1 local_90 [8];
  json_value local_88;
  int local_6c;
  undefined1 local_68 [8];
  json_value local_60;
  _Any_data *local_48;
  json_value *local_40;
  string *local_38;
  
  if (result->m_type != discarded) {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
    result->m_type = discarded;
  }
  switch(this->last_token) {
  case literal_true:
    result->m_type = boolean;
    (result->m_value).number_integer = 1;
    break;
  case literal_false:
    result->m_type = boolean;
    (result->m_value).object = (object_t *)0x0;
    break;
  case literal_null:
    result->m_type = null;
    break;
  case value_string:
    result->m_type = string;
    jVar6.object = (object_t *)
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::create<std::__cxx11::string,std::__cxx11::string>
                             (&(this->m_lexer).token_buffer);
    goto LAB_0012e5c3;
  case value_unsigned:
    result->m_type = number_unsigned;
    jVar6 = (json_value)(this->m_lexer).value_unsigned;
    goto LAB_0012e5c3;
  case value_integer:
    result->m_type = number_integer;
    jVar6 = (json_value)(this->m_lexer).value_integer;
LAB_0012e5c3:
    result->m_value = jVar6;
    break;
  case value_float:
    result->m_type = number_float;
    nVar2 = (this->m_lexer).value_float;
    (result->m_value).number_unsigned = (number_unsigned_t)nVar2;
    if (0x7fefffffffffffff < (ulong)ABS(nVar2)) {
      if (this->allow_exceptions == true) {
LAB_0012eb67:
        __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_68,&this->m_lexer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"number overflow parsing \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        plVar9 = (long *)std::__cxx11::string::append(local_90);
        local_c0 = (undefined1  [8])*plVar9;
        psVar10 = (size_type *)(plVar9 + 2);
        if (local_c0 == (undefined1  [8])psVar10) {
          local_b0._M_allocated_capacity = *psVar10;
          local_b0._8_8_ = plVar9[3];
          local_c0 = (undefined1  [8])(local_c0 + 0x10);
        }
        else {
          local_b0._M_allocated_capacity = *psVar10;
        }
        local_b8 = *(json_value *)(plVar9 + 1);
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        out_of_range::create(__return_storage_ptr__,0x196,(string *)local_c0);
        __cxa_throw(__return_storage_ptr__,&out_of_range::typeinfo,exception::~exception);
      }
      if (this->last_token != uninitialized) {
        this->errored = true;
        this->expected = uninitialized;
      }
    }
    break;
  case begin_array:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        local_c0._0_4_ = this->depth;
        this->depth = local_c0._0_4_ + 1;
        local_90[0] = array_start;
        keep = (*(this->callback)._M_invoker)
                         ((_Any_data *)&this->callback,(int *)local_c0,local_90,result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_0012e935;
      }
      result->m_type = array;
      paVar8 = (array_t *)operator_new(0x18);
      (paVar8->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (paVar8->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (paVar8->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (result->m_value).array = paVar8;
    }
    else {
      keep = false;
    }
LAB_0012e935:
    tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(&this->m_lexer);
    this->last_token = tVar5;
    if (tVar5 != end_array) {
      local_c0 = (undefined1  [8])((ulong)local_c0 & 0xffffffffffffff00);
      local_b8.object = (object_t *)0x0;
      local_98 = (json_value *)&result->m_value;
      t = null;
      local_a0 = &this->m_lexer;
      do {
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_c0 + 8),t);
        local_c0[0] = 8;
        parse_internal(this,keep,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_c0);
        this_00 = local_a0;
        if (this->errored != false) {
LAB_0012eb2b:
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_c0 + 8),local_c0[0]);
          return;
        }
        if ((keep != false) && (local_c0[0] != discarded)) {
          std::
          vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
          ::
          emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                       **)local_98,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_c0);
        }
        tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        this->last_token = tVar5;
        if (tVar5 != value_separator) {
          if (tVar5 == end_array) {
            if ((keep != false) &&
               ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
              iVar11 = this->depth + -1;
              this->depth = iVar11;
              bVar4 = std::
                      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                      ::operator()(&this->callback,iVar11,array_end,result);
              if (!bVar4) {
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::json_value::destroy(local_98,result->m_type);
                result->m_type = discarded;
              }
            }
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_c0 + 8),local_c0[0]);
            goto switchD_0012e4df_caseD_10;
          }
          this->errored = true;
          this->expected = end_array;
          if (this->allow_exceptions == true) {
            throw_exception(this);
          }
          goto LAB_0012eb2b;
        }
        tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        this->last_token = tVar5;
        t = local_c0[0];
      } while( true );
    }
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) break;
    iVar11 = this->depth + -1;
    this->depth = iVar11;
    local_c0._0_4_ = iVar11;
    local_90[0] = array_end;
    bVar4 = (*(this->callback)._M_invoker)
                      ((_Any_data *)&this->callback,(int *)local_c0,local_90,result);
    goto LAB_0012e973;
  case begin_object:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        local_c0._0_4_ = this->depth;
        this->depth = local_c0._0_4_ + 1;
        local_90[0] = object_start;
        keep = (*(this->callback)._M_invoker)
                         ((_Any_data *)&this->callback,(int *)local_c0,local_90,result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_0012e694;
      }
      result->m_type = object;
      poVar7 = (object_t *)operator_new(0x30);
      p_Var1 = &(poVar7->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined1 (*) [16])&(poVar7->_M_t)._M_impl = (undefined1  [16])0x0;
      (poVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (poVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (poVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (poVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      (result->m_value).object = poVar7;
    }
    else {
      keep = false;
    }
LAB_0012e694:
    local_a0 = &this->m_lexer;
    tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(local_a0);
    this->last_token = tVar5;
    if (tVar5 != end_object) {
      local_c0 = (undefined1  [8])(local_c0 + 0x10);
      local_b8.object = (object_t *)0x0;
      local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
      local_90[0] = object_start;
      local_88.object = (object_t *)0x0;
      if (tVar5 == value_string) {
        local_38 = (string *)&(this->m_lexer).token_buffer;
        local_48 = (_Any_data *)&this->callback;
        local_40 = (json_value *)&result->m_value;
        local_98 = (json_value *)CONCAT44(local_98._4_4_,(uint)keep);
        do {
          std::__cxx11::string::operator=((string *)local_c0,local_38);
          bVar4 = true;
          if (keep != false) {
            if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
              bVar4 = false;
            }
            else {
              local_60.object = (object_t *)0x0;
              local_68[0] = string;
              local_60.object =
                   (object_t *)
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::create<std::__cxx11::string,std::__cxx11::string_const&>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0);
              local_6c = this->depth;
              local_c1 = key;
              if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
                goto LAB_0012eb67;
              }
              bVar4 = (*(this->callback)._M_invoker)
                                (local_48,&local_6c,&local_c1,
                                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_68);
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
              bVar4 = !bVar4;
            }
          }
          tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(local_a0);
          this->last_token = tVar5;
          if (tVar5 != name_separator) {
            this->errored = true;
            this->expected = name_separator;
            bVar3 = true;
            if (this->allow_exceptions == true) {
LAB_0012eb5a:
              throw_exception(this);
            }
            goto LAB_0012e8d7;
          }
          tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(local_a0);
          this->last_token = tVar5;
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_90 + 8),local_90[0]);
          local_90[0] = 8;
          parse_internal(this,SUB81(local_98,0),
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_90);
          bVar3 = true;
          if (this->errored != false) goto LAB_0012e8d7;
          if ((!bVar4 && keep == true) && (local_90[0] != 8)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
            ::
            _M_emplace_unique<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                      (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         **)local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_90);
          }
          tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(local_a0);
          this->last_token = tVar5;
          if (tVar5 != value_separator) {
            if (tVar5 == end_object) {
              bVar3 = false;
              if ((keep != false) &&
                 (bVar3 = false,
                 (this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
                iVar11 = this->depth + -1;
                this->depth = iVar11;
                bVar4 = std::
                        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                        ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                                      *)local_48,iVar11,object_end,result);
                if (!bVar4) {
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::json_value::destroy(local_40,result->m_type);
                  result->m_type = discarded;
                }
                bVar3 = false;
              }
            }
            else {
              this->errored = true;
              this->expected = end_object;
              if (this->allow_exceptions != false) goto LAB_0012eb5a;
            }
            goto LAB_0012e8d7;
          }
          tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(local_a0);
          this->last_token = tVar5;
        } while (tVar5 == value_string);
      }
      this->errored = true;
      this->expected = value_string;
      bVar3 = true;
      if (this->allow_exceptions == true) {
        throw_exception(this);
      }
LAB_0012e8d7:
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_90 + 8),local_90[0]);
      if (local_c0 != (undefined1  [8])(local_c0 + 0x10)) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar3) {
        return;
      }
      break;
    }
    if ((keep == false) || ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0))
    break;
    iVar11 = this->depth + -1;
    this->depth = iVar11;
    bVar4 = std::
            function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
            ::operator()(&this->callback,iVar11,object_end,result);
LAB_0012e973:
    if (bVar4 == false) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
      result->m_type = discarded;
    }
    break;
  default:
    this->errored = true;
    this->expected = literal_or_value;
    goto LAB_0012e5dd;
  case parse_error:
    this->errored = true;
    this->expected = uninitialized;
LAB_0012e5dd:
    if (this->allow_exceptions != true) {
      return;
    }
    throw_exception(this);
  case literal_or_value:
    break;
  }
switchD_0012e4df_caseD_10:
  if ((keep != false) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_c0._0_4_ = this->depth;
    local_90[0] = value;
    bVar4 = (*(this->callback)._M_invoker)
                      ((_Any_data *)&this->callback,(int *)local_c0,local_90,result);
    if (!bVar4) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
      result->m_type = discarded;
    }
  }
  return;
}

Assistant:

void parse_internal(bool keep, BasicJsonType& result)
{
// never parse after a parse error was detected
assert(not errored);

// start with a discarded value
if (not result.is_discarded())
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}

switch (last_token)
{
case token_type::begin_object:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::object_start, result);
}

if (not callback or keep)
{
// explicitly set result to object to cope with {}
result.m_type = value_t::object;
result.m_value = value_t::object;
}
}

// read next token
get_token();

// closing } -> we are done
if (last_token == token_type::end_object)
{
if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
string_t key;
BasicJsonType value;
while (true)
{
// store key
if (not expect(token_type::value_string))
{
return;
}
key = m_lexer.move_string();

bool keep_tag = false;
if (keep)
{
if (callback)
{
BasicJsonType k(key);
keep_tag = callback(depth, parse_event_t::key, k);
}
else
{
keep_tag = true;
}
}

// parse separator (:)
get_token();
if (not expect(token_type::name_separator))
{
return;
}

// parse and add value
get_token();
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and keep_tag and not value.is_discarded())
{
result.m_value.object->emplace(std::move(key), std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing }
if (not expect(token_type::end_object))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::begin_array:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::array_start, result);
}

if (not callback or keep)
{
// explicitly set result to array to cope with []
result.m_type = value_t::array;
result.m_value = value_t::array;
}
}

// read next token
get_token();

// closing ] -> we are done
if (last_token == token_type::end_array)
{
if (callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
BasicJsonType value;
while (true)
{
// parse value
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and not value.is_discarded())
{
result.m_value.array->push_back(std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing ]
if (not expect(token_type::end_array))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::literal_null:
{
result.m_type = value_t::null;
break;
}

case token_type::value_string:
{
result.m_type = value_t::string;
result.m_value = m_lexer.move_string();
break;
}

case token_type::literal_true:
{
result.m_type = value_t::boolean;
result.m_value = true;
break;
}

case token_type::literal_false:
{
result.m_type = value_t::boolean;
result.m_value = false;
break;
}

case token_type::value_unsigned:
{
result.m_type = value_t::number_unsigned;
result.m_value = m_lexer.get_number_unsigned();
break;
}

case token_type::value_integer:
{
result.m_type = value_t::number_integer;
result.m_value = m_lexer.get_number_integer();
break;
}

case token_type::value_float:
{
result.m_type = value_t::number_float;
result.m_value = m_lexer.get_number_float();

// throw in case of infinity or NAN
if (JSON_UNLIKELY(not std::isfinite(result.m_value.number_float)))
{
if (allow_exceptions)
{
JSON_THROW(out_of_range::create(406, "number overflow parsing '" +
m_lexer.get_token_string() + "'"));
}
expect(token_type::uninitialized);
}
break;
}

case token_type::parse_error:
{
// using "uninitialized" to avoid "expected" message
if (not expect(token_type::uninitialized))
{
return;
}
break; // LCOV_EXCL_LINE
}

default:
{
// the last token was unexpected; we expected a value
if (not expect(token_type::literal_or_value))
{
return;
}
break; // LCOV_EXCL_LINE
}
}

if (keep and callback and not callback(depth, parse_event_t::value, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
}